

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_Minify(char *json)

{
  uchar *puVar1;
  uchar *puVar2;
  bool bVar3;
  uchar *local_18;
  uchar *into;
  char *json_local;
  
  local_18 = (uchar *)json;
  into = (uchar *)json;
  while (*into != '\0') {
    if (*into == ' ') {
      into = into + 1;
    }
    else if (*into == '\t') {
      into = into + 1;
    }
    else if (*into == '\r') {
      into = into + 1;
    }
    else if (*into == '\n') {
      into = into + 1;
    }
    else if ((*into == '/') && (into[1] == '/')) {
      while( true ) {
        bVar3 = false;
        if (*into != '\0') {
          bVar3 = *into != '\n';
        }
        if (!bVar3) break;
        into = into + 1;
      }
    }
    else if ((*into == '/') && (into[1] == '*')) {
      while( true ) {
        bVar3 = false;
        if (*into != '\0') {
          bVar3 = false;
          if (*into == '*') {
            bVar3 = into[1] == '/';
          }
          bVar3 = (bool)(bVar3 ^ 1);
        }
        if (!bVar3) break;
        into = into + 1;
      }
      into = into + 2;
    }
    else if (*into == '\"') {
      *local_18 = *into;
      puVar1 = local_18;
      puVar2 = into;
      while( true ) {
        into = puVar2 + 1;
        local_18 = puVar1 + 1;
        bVar3 = false;
        if (*into != '\0') {
          bVar3 = *into != '\"';
        }
        if (!bVar3) break;
        if (*into == '\\') {
          *local_18 = *into;
          local_18 = puVar1 + 2;
          into = puVar2 + 2;
        }
        *local_18 = *into;
        puVar1 = local_18;
        puVar2 = into;
      }
      *local_18 = *into;
      local_18 = puVar1 + 2;
      into = puVar2 + 2;
    }
    else {
      *local_18 = *into;
      local_18 = local_18 + 1;
      into = into + 1;
    }
  }
  *local_18 = '\0';
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_Minify(char *json)
{
    unsigned char *into = (unsigned char*)json;
    while (*json)
    {
        if (*json == ' ')
        {
            json++;
        }
        else if (*json == '\t')
        {
            /* Whitespace characters. */
            json++;
        }
        else if (*json == '\r')
        {
            json++;
        }
        else if (*json=='\n')
        {
            json++;
        }
        else if ((*json == '/') && (json[1] == '/'))
        {
            /* double-slash comments, to end of line. */
            while (*json && (*json != '\n'))
            {
                json++;
            }
        }
        else if ((*json == '/') && (json[1] == '*'))
        {
            /* multiline comments. */
            while (*json && !((*json == '*') && (json[1] == '/')))
            {
                json++;
            }
            json += 2;
        }
        else if (*json == '\"')
        {
            /* string literals, which are \" sensitive. */
            *into++ = (unsigned char)*json++;
            while (*json && (*json != '\"'))
            {
                if (*json == '\\')
                {
                    *into++ = (unsigned char)*json++;
                }
                *into++ = (unsigned char)*json++;
            }
            *into++ = (unsigned char)*json++;
        }
        else
        {
            /* All other characters. */
            *into++ = (unsigned char)*json++;
        }
    }

    /* and null-terminate. */
    *into = '\0';
}